

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O1

void sha512_Final(SHA512_CTX *context,sha2_byte *digest)

{
  uint64_t *data;
  ulong uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  int j;
  uint uVar9;
  long lVar10;
  uint uVar11;
  
  if (digest != (sha2_byte *)0x0) {
    uVar11 = (uint)context->bitcount[0] >> 3 & 0x7f;
    data = context->buffer;
    uVar9 = uVar11 + 1;
    *(undefined1 *)((long)context->buffer + (ulong)uVar11) = 0x80;
    if (0x6f < uVar11) {
      memzero((void *)((ulong)uVar9 + (long)data),(ulong)(uVar11 ^ 0x7f));
      lVar10 = 10;
      do {
        uVar1 = context->state[lVar10];
        context->state[lVar10] =
             uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
             (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
             (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x1a);
      sha512_Transform(context->state,data,context->state);
      uVar9 = 0;
    }
    memzero((void *)((ulong)uVar9 + (long)data),(ulong)(0x70 - uVar9));
    lVar10 = 10;
    do {
      uVar1 = context->state[lVar10];
      context->state[lVar10] =
           uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x18);
    uVar2 = context->bitcount[0];
    context->buffer[0xe] = context->bitcount[1];
    context->buffer[0xf] = uVar2;
    sha512_Transform(context->state,data,context->state);
    lVar10 = 0;
    do {
      uVar1 = context->state[lVar10];
      context->state[lVar10] =
           uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18 |
           (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
           (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 8);
    uVar2 = context->state[0];
    uVar3 = context->state[1];
    uVar4 = context->state[2];
    uVar5 = context->state[3];
    uVar6 = context->state[4];
    uVar7 = context->state[5];
    uVar8 = context->state[7];
    *(uint64_t *)(digest + 0x30) = context->state[6];
    *(uint64_t *)(digest + 0x38) = uVar8;
    *(uint64_t *)(digest + 0x20) = uVar6;
    *(uint64_t *)(digest + 0x28) = uVar7;
    *(uint64_t *)(digest + 0x10) = uVar4;
    *(uint64_t *)(digest + 0x18) = uVar5;
    *(uint64_t *)digest = uVar2;
    *(uint64_t *)(digest + 8) = uVar3;
  }
  memzero(context,0xd0);
  return;
}

Assistant:

void sha512_Final(trezor::SHA512_CTX* context, sha2_byte digest[]) {
	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha2_byte*)0) {
		sha512_Last(context);

		/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert FROM host byte order */
		for (int j = 0; j < 8; j++) {
			REVERSE64(context->state[j],context->state[j]);
		}
#endif
		MEMCPY_BCOPY(digest, context->state, SHA512_DIGEST_LENGTH);
	}

	/* Zero out state data */
	memzero(context, sizeof(trezor::SHA512_CTX));
}